

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O2

idx_t duckdb::InitialNestedLoopJoin::Operation<int,duckdb::DistinctFrom>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count)

{
  sel_t *psVar1;
  sel_t *psVar2;
  ulong uVar3;
  idx_t iVar4;
  idx_t iVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  UnifiedVectorFormat right_data;
  UnifiedVectorFormat left_data;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(left,left_size,&local_78);
  Vector::ToUnifiedFormat(right,right_size,&local_c0);
  iVar4 = *rpos;
  iVar5 = 0;
  do {
    if (right_size <= iVar4) {
LAB_00ab0755:
      UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
      UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
      return iVar5;
    }
    if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
      iVar4 = (idx_t)(local_c0.sel)->sel_vector[iVar4];
    }
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      bVar7 = false;
    }
    else {
      bVar7 = (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar4 >> 6] >> (iVar4 & 0x3f) & 1) == 0;
    }
    psVar1 = lvector->sel_vector;
    psVar2 = rvector->sel_vector;
    uVar3 = *lpos;
    while (uVar3 < left_size) {
      if (iVar5 == 0x800) {
        iVar5 = 0x800;
        goto LAB_00ab0755;
      }
      uVar6 = uVar3;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)(local_78.sel)->sel_vector[uVar3];
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar8 = false;
      }
      else {
        bVar8 = (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0;
      }
      if ((bVar7 | bVar8) == 1) {
        if (bVar7 != bVar8) {
LAB_00ab0703:
          psVar1[iVar5] = (sel_t)uVar3;
          psVar2[iVar5] = (sel_t)*rpos;
          iVar5 = iVar5 + 1;
        }
      }
      else if (*(int *)(local_78.data + uVar6 * 4) != *(int *)(local_c0.data + iVar4 * 4))
      goto LAB_00ab0703;
      uVar3 = uVar3 + 1;
      *lpos = uVar3;
    }
    *lpos = 0;
    iVar4 = *rpos + 1;
    *rpos = iVar4;
  } while( true );
}

Assistant:

static idx_t Operation(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos, idx_t &rpos,
	                       SelectionVector &lvector, SelectionVector &rvector, idx_t current_match_count) {
		using MATCH_OP = ComparisonOperationWrapper<OP>;

		// initialize phase of nested loop join
		// fill lvector and rvector with matches from the base vectors
		UnifiedVectorFormat left_data, right_data;
		left.ToUnifiedFormat(left_size, left_data);
		right.ToUnifiedFormat(right_size, right_data);

		auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
		auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
		idx_t result_count = 0;
		for (; rpos < right_size; rpos++) {
			idx_t right_position = right_data.sel->get_index(rpos);
			bool right_is_valid = right_data.validity.RowIsValid(right_position);
			for (; lpos < left_size; lpos++) {
				if (result_count == STANDARD_VECTOR_SIZE) {
					// out of space!
					return result_count;
				}
				idx_t left_position = left_data.sel->get_index(lpos);
				bool left_is_valid = left_data.validity.RowIsValid(left_position);
				if (MATCH_OP::Operation(ldata[left_position], rdata[right_position], !left_is_valid, !right_is_valid)) {
					// emit tuple
					lvector.set_index(result_count, lpos);
					rvector.set_index(result_count, rpos);
					result_count++;
				}
			}
			lpos = 0;
		}
		return result_count;
	}